

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casts.h
# Opt level: O1

void __thiscall
CoreML::Specification::TreeEnsembleClassifier::CheckTypeAndMergeFrom
          (TreeEnsembleClassifier *this,MessageLite *from)

{
  int iVar1;
  ulong uVar2;
  LogMessage *other;
  TreeEnsembleParameters *pTVar3;
  StringVector *pSVar4;
  Int64Vector *pIVar5;
  undefined1 *puVar6;
  Arena *pAVar7;
  LogFinisher LStack_51;
  LogMessage LStack_50;
  
  if (from->_vptr_MessageLite != (_func_int **)&PTR__TreeEnsembleClassifier_004bc398) {
    __assert_fail("f == nullptr || dynamic_cast<To>(f) != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/stubs/casts.h"
                  ,0x5e,
                  "To google::protobuf::internal::down_cast(From *) [To = const CoreML::Specification::TreeEnsembleClassifier *, From = const google::protobuf::MessageLite]"
                 );
  }
  if ((TreeEnsembleClassifier *)from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&LStack_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O1/mlmodel/format/TreeEnsemble.pb.cc"
               ,0x5bc);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&LStack_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&LStack_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&LStack_50);
  }
  if ((from != (MessageLite *)_TreeEnsembleClassifier_default_instance_) &&
     (from[1]._vptr_MessageLite != (_func_int **)0x0)) {
    if (this->treeensemble_ == (TreeEnsembleParameters *)0x0) {
      uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar7 = (Arena *)(uVar2 & 0xfffffffffffffffc);
      if ((uVar2 & 1) != 0) {
        pAVar7 = *(Arena **)pAVar7;
      }
      pTVar3 = google::protobuf::Arena::
               CreateMaybeMessage<CoreML::Specification::TreeEnsembleParameters>(pAVar7);
      this->treeensemble_ = pTVar3;
    }
    puVar6 = (undefined1 *)from[1]._vptr_MessageLite;
    if ((TreeEnsembleParameters *)puVar6 == (TreeEnsembleParameters *)0x0) {
      puVar6 = _TreeEnsembleParameters_default_instance_;
    }
    TreeEnsembleParameters::MergeFrom(this->treeensemble_,(TreeEnsembleParameters *)puVar6);
  }
  iVar1 = (int)from[1]._internal_metadata_.ptr_;
  if (iVar1 != 0) {
    this->postevaluationtransform_ = iVar1;
  }
  iVar1 = *(int *)((long)&from[2]._internal_metadata_.ptr_ + 4);
  if (iVar1 == 0x65) {
    if (this->_oneof_case_[0] != 0x65) {
      clear_ClassLabels(this);
      this->_oneof_case_[0] = 0x65;
      uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar7 = (Arena *)(uVar2 & 0xfffffffffffffffc);
      if ((uVar2 & 1) != 0) {
        pAVar7 = *(Arena **)pAVar7;
      }
      pIVar5 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64Vector>
                         (pAVar7);
      (this->ClassLabels_).int64classlabels_ = pIVar5;
    }
    if (*(int *)((long)&from[2]._internal_metadata_.ptr_ + 4) == 0x65) {
      puVar6 = (undefined1 *)from[2]._vptr_MessageLite;
    }
    else {
      puVar6 = _Int64Vector_default_instance_;
    }
    Int64Vector::MergeFrom((this->ClassLabels_).int64classlabels_,(Int64Vector *)puVar6);
  }
  else if (iVar1 == 100) {
    if (this->_oneof_case_[0] != 100) {
      clear_ClassLabels(this);
      this->_oneof_case_[0] = 100;
      uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar7 = (Arena *)(uVar2 & 0xfffffffffffffffc);
      if ((uVar2 & 1) != 0) {
        pAVar7 = *(Arena **)pAVar7;
      }
      pSVar4 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StringVector>
                         (pAVar7);
      (this->ClassLabels_).stringclasslabels_ = pSVar4;
    }
    if (*(int *)((long)&from[2]._internal_metadata_.ptr_ + 4) == 100) {
      puVar6 = (undefined1 *)from[2]._vptr_MessageLite;
    }
    else {
      puVar6 = _StringVector_default_instance_;
    }
    StringVector::MergeFrom((this->ClassLabels_).stringclasslabels_,(StringVector *)puVar6);
  }
  uVar2 = (from->_internal_metadata_).ptr_;
  if ((uVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar2 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

inline To down_cast(From* f) {                   // so we only accept pointers
  // Ensures that To is a sub-type of From *.  This test is here only
  // for compile-time type checking, and has no overhead in an
  // optimized build at run-time, as it will be optimized away
  // completely.
  if (false) {
    implicit_cast<From*, To>(0);
  }

#if !defined(NDEBUG) && PROTOBUF_RTTI
  assert(f == nullptr || dynamic_cast<To>(f) != nullptr);  // RTTI: debug mode only!
#endif
  return static_cast<To>(f);
}